

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_finish(http_s *r)

{
  FIOBJ FVar1;
  
  if ((r != (http_s *)0x0) && ((r->private_data).vtbl != (void *)0x0)) {
    if (add_content_length_cl_hash == 0) {
      add_content_length_cl_hash = fio_siphash13("content-length",0xe,0x144e87,0x1453b6);
    }
    FVar1 = fiobj_hash_get2((r->private_data).out_headers,add_content_length_cl_hash);
    if (FVar1 == 0) {
      fiobj_hash_set((r->private_data).out_headers,HTTP_HEADER_CONTENT_LENGTH,1);
    }
    add_date(r);
    (**(code **)((long)(r->private_data).vtbl + 0x18))(r);
    return;
  }
  return;
}

Assistant:

void http_finish(http_s *r) {
  if (!r || !r->private_data.vtbl) {
    return;
  }
  add_content_length(r, 0);
  add_date(r);
  ((http_vtable_s *)r->private_data.vtbl)->http_finish(r);
}